

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O0

void __thiscall SharedDirectory::on_finished_writing(SharedDirectory *this,string *name)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  Error *pEVar4;
  uintmax_t local_98;
  uint64_t size;
  undefined1 local_70 [8];
  path p;
  uint64_t promised_size;
  _Self local_28;
  _Self local_20;
  iterator it;
  string *name_local;
  SharedDirectory *this_local;
  
  it._M_node = (_Base_ptr)name;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(&this->pending_files,name);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(&this->pending_files);
  bVar2 = std::operator==(&local_20,&local_28);
  if (bVar2) {
    pEVar4 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(pEVar4,"Not registered file");
    __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
           ::operator->(&local_20);
  uVar1 = ppVar3->second;
  p.m_pathname.field_2._8_8_ =
       std::
       map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
       ::erase_abi_cxx11_((map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                           *)&this->pending_files,(iterator)local_20._M_node);
  std::__cxx11::string::string((string *)&size,(string *)name);
  path_in_dir((path *)local_70,this,(string *)&size);
  std::__cxx11::string::~string((string *)&size);
  bVar2 = boost::filesystem::exists((path *)local_70);
  if (!bVar2) {
    pEVar4 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(pEVar4,"File not exists");
    __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
  }
  local_98 = boost::filesystem::file_size((path *)local_70);
  if (uVar1 < local_98) {
    boost::filesystem::remove(local_70);
    this->remaining_space = uVar1 + this->remaining_space;
  }
  else {
    this->remaining_space = this->remaining_space + (uVar1 - local_98);
    std::
    map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
    ::emplace<std::__cxx11::string&,unsigned_long&>
              ((map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                *)this,name,&local_98);
  }
  boost::filesystem::path::~path((path *)local_70);
  return;
}

Assistant:

void SharedDirectory::on_finished_writing(std::string name) {
  auto it = pending_files.find(name);
  if (it == pending_files.end()) {
    throw Error("Not registered file");
  }
  uint64_t promised_size = it->second;
  pending_files.erase(it);
  path p = path_in_dir(name);
  if (!exists(p)) {
    throw Error("File not exists");
  }
  uint64_t size = file_size(p);
  if (size > promised_size) {
    remove(p);
    remaining_space += promised_size;
  } else {
    remaining_space += promised_size - size;
    indexed_files.emplace(name, size);
  }
}